

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::
ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
::ArrayWithPreallocation
          (ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
           *this,ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
                 *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  
  this->numActive = 0;
  this->numAllocated = 4;
  uVar6 = other->numAllocated;
  if (4 < uVar6) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar6;
    other->items = (Source *)other->space;
    other->numAllocated = 4;
    other->numActive = 0;
    return;
  }
  this->items = (Source *)this->space;
  sVar3 = other->numActive;
  this->numActive = sVar3;
  if (sVar3 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&other->items->node + lVar5);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&this->items->node + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < this->numActive);
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }